

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

void __thiscall lest::got::~got(got *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)&(this->super_success).super_message = &PTR__message_00275ba8;
  pcVar2 = (this->super_success).super_message.note.info._M_dataplus._M_p;
  paVar1 = &(this->super_success).super_message.note.info.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_success).super_message.where.file._M_dataplus._M_p;
  paVar1 = &(this->super_success).super_message.where.file.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_success).super_message.kind._M_dataplus._M_p;
  paVar1 = &(this->super_success).super_message.kind.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::runtime_error::~runtime_error((runtime_error *)this);
  operator_delete(this,0x78);
  return;
}

Assistant:

got( location where_, text expr_)
    : success( "passed: got exception", where_, expr_) {}